

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void wabt::WriteLimitsData(Stream *stream,Limits *limits)

{
  if (limits->is_64 == true) {
    WriteU64Leb128(stream,limits->initial,"limits: initial");
    if (limits->has_max == true) {
      WriteU64Leb128(stream,limits->max,"limits: max");
      return;
    }
  }
  else {
    WriteU32Leb128(stream,(uint32_t)limits->initial,"limits: initial");
    if (limits->has_max == true) {
      WriteU32Leb128(stream,(uint32_t)limits->max,"limits: max");
      return;
    }
  }
  return;
}

Assistant:

void WriteLimitsData(Stream* stream, const Limits* limits) {
  if (limits->is_64) {
    WriteU64Leb128(stream, limits->initial, "limits: initial");
    if (limits->has_max) {
      WriteU64Leb128(stream, limits->max, "limits: max");
    }
  } else {
    WriteU32Leb128(stream, limits->initial, "limits: initial");
    if (limits->has_max) {
      WriteU32Leb128(stream, limits->max, "limits: max");
    }
  }
}